

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

bool __thiscall QGraphicsViewPrivate::updateRect(QGraphicsViewPrivate *this,QRect *r)

{
  uint uVar1;
  ViewportUpdateMode VVar2;
  QWidgetData *pQVar3;
  bool bVar4;
  QWidget *this_00;
  long in_FS_OFFSET;
  QRect QVar5;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)&this->field_0x300;
  if (((uVar1 >> 0xc & 1) == 0) && (VVar2 = this->viewportUpdateMode, VVar2 != NoViewportUpdate)) {
    this_00 = (this->super_QAbstractScrollAreaPrivate).viewport;
    pQVar3 = this_00->data;
    bVar4 = intersectsViewport(r,((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1,
                               ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1);
    QVar5.x2.m_i = local_48.x2.m_i;
    QVar5.y2.m_i = local_48.y2.m_i;
    QVar5.x1.m_i = local_48.x1.m_i;
    QVar5.y1.m_i = local_48.y1.m_i;
    if (bVar4) {
      bVar4 = true;
      if (VVar2 - MinimalViewportUpdate < 2) {
        if ((uVar1 >> 0xd & 1) != 0) {
          QVar5 = (QRect)QRect::operator&(r,&this->updateClip);
          r = &local_48;
        }
        local_48 = QVar5;
        QRegion::operator+=(&this->dirtyRegion,r);
        goto LAB_005bb8aa;
      }
      if (VVar2 == BoundingRectViewportUpdate) {
        if ((uVar1 >> 0xd & 1) != 0) {
          QVar5 = (QRect)QRect::operator&(r,&this->updateClip);
          r = &local_48;
        }
        local_48 = QVar5;
        QRect_unite(&this->dirtyBoundingRect,r);
        if ((0 < (this->dirtyBoundingRect).x1.m_i) || (0 < (this->dirtyBoundingRect).y1.m_i))
        goto LAB_005bb8aa;
        this_00 = (this->super_QAbstractScrollAreaPrivate).viewport;
        pQVar3 = this_00->data;
        if (((this->dirtyBoundingRect).x2.m_i < (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) ||
           ((this->dirtyBoundingRect).y2.m_i < (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i))
        goto LAB_005bb8aa;
        this->field_0x301 = this->field_0x301 | 0x10;
      }
      else {
        local_48 = QVar5;
        if (VVar2 != FullViewportUpdate) goto LAB_005bb8aa;
        *(uint *)&this->field_0x300 = uVar1 | 0x1000;
      }
      QWidget::update(this_00);
      goto LAB_005bb8aa;
    }
  }
  bVar4 = false;
LAB_005bb8aa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QGraphicsViewPrivate::updateRect(const QRect &r)
{
    if (fullUpdatePending || viewportUpdateMode == QGraphicsView::NoViewportUpdate
        || !intersectsViewport(r, viewport->width(), viewport->height())) {
        return false;
    }

    switch (viewportUpdateMode) {
    case QGraphicsView::FullViewportUpdate:
        fullUpdatePending = true;
        viewport->update();
        break;
    case QGraphicsView::BoundingRectViewportUpdate:
        if (hasUpdateClip)
            QRect_unite(&dirtyBoundingRect, r & updateClip);
        else
            QRect_unite(&dirtyBoundingRect, r);
        if (containsViewport(dirtyBoundingRect, viewport->width(), viewport->height())) {
            fullUpdatePending = true;
            viewport->update();
        }
        break;
    case QGraphicsView::SmartViewportUpdate: // ### DEPRECATE
    case QGraphicsView::MinimalViewportUpdate:
        if (hasUpdateClip)
            dirtyRegion += r & updateClip;
        else
            dirtyRegion += r;
        break;
    default:
        break;
    }

    return true;
}